

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class1_test_matching.cc
# Opt level: O2

void feature_set_matching(Ptr *image1,Ptr *image2)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> this;
  int iVar1;
  ostream *poVar2;
  size_t i;
  ulong uVar3;
  long lVar4;
  undefined1 local_3a8 [8];
  FeatureSet feat1;
  FeatureSet feat2;
  undefined4 uStack_270;
  Options feature_set_opts;
  Result sift_matching;
  Result surf_matching;
  Result matching;
  vector<features::Visualizer::Keypoint,_std::allocator<features::Visualizer::Keypoint>_> features1;
  undefined1 auStack_198 [8];
  vector<features::Visualizer::Keypoint,_std::allocator<features::Visualizer::Keypoint>_> features2;
  __shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2> local_178;
  __shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2> local_168;
  __shared_ptr<core::Image<unsigned_char>const,(__gnu_cxx::_Lock_policy)2> local_158 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_150;
  __shared_ptr<core::Image<unsigned_char>const,(__gnu_cxx::_Lock_policy)2> local_148 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_140;
  __shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2> local_138;
  __shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2> local_128;
  __shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2> local_118;
  undefined1 auStack_108 [8];
  AlignedMemory<math::Vec128f,_16> sift_descr1;
  undefined1 auStack_e8 [8];
  AlignedMemory<math::Vec64f,_16> surf_descr1;
  Options sift_matching_opts;
  Options surf_matching_opts;
  Ptr match_image;
  undefined1 auStack_98 [8];
  AlignedMemory<math::Vec128f,_16> sift_descr2;
  undefined1 auStack_78 [8];
  AlignedMemory<math::Vec64f,_16> surf_descr2;
  undefined1 local_58 [8];
  string output_filename;
  
  sfm::FeatureSet::Options::Options((Options *)&feat2.field_0x94);
  feat2._148_4_ = 1;
  feature_set_opts.sift_opts.base_blur_sigma =
       (float)CONCAT31(feature_set_opts.sift_opts.base_blur_sigma._1_3_,1);
  feat1.surf_descriptors.
  super__Vector_base<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  feat1.surf_descriptors.
  super__Vector_base<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  feat1.sift_descriptors.
  super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  feat1.sift_descriptors.
  super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  feat1.colors.
  super__Vector_base<math::Vector<unsigned_char,_3>,_std::allocator<math::Vector<unsigned_char,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  feat1.sift_descriptors.
  super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  feat1.colors.
  super__Vector_base<math::Vector<unsigned_char,_3>,_std::allocator<math::Vector<unsigned_char,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  feat1.colors.
  super__Vector_base<math::Vector<unsigned_char,_3>,_std::allocator<math::Vector<unsigned_char,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  feat1.positions.
  super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  feat1.positions.
  super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  feat1.width = 0;
  feat1.height = 0;
  feat1.positions.
  super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  feat1.surf_descriptors.
  super__Vector_base<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
  feat1.opts.sift_opts.num_samples_per_octave = feature_set_opts.sift_opts.num_samples_per_octave;
  feat1.opts.sift_opts.min_octave = feature_set_opts.sift_opts.min_octave;
  feat1.opts.sift_opts.max_octave = feature_set_opts.sift_opts.max_octave;
  feat1.opts.sift_opts.base_blur_sigma._0_1_ = 1;
  feat1.opts.sift_opts.inherent_blur_sigma = feature_set_opts.sift_opts.inherent_blur_sigma;
  feat1.opts.sift_opts.verbose_output = feature_set_opts.sift_opts.verbose_output;
  feat1.opts.sift_opts.base_blur_sigma._1_3_ = feature_set_opts.sift_opts.base_blur_sigma._1_3_;
  feat1.opts.sift_opts.debug_output = feature_set_opts.sift_opts.debug_output;
  feat1.opts.sift_opts._30_1_ = feature_set_opts.sift_opts._30_1_;
  feat1.opts.sift_opts._31_1_ = feature_set_opts.sift_opts._31_1_;
  std::__shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_178,
             &image1->super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>);
  sfm::FeatureSet::compute_features((FeatureSet *)local_3a8,(Ptr *)&local_178);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_178._M_refcount);
  feat2.surf_descriptors.
  super__Vector_base<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  feat2.surf_descriptors.
  super__Vector_base<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  feat2.sift_descriptors.
  super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  feat2.sift_descriptors.
  super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  feat2.colors.
  super__Vector_base<math::Vector<unsigned_char,_3>,_std::allocator<math::Vector<unsigned_char,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  feat2.sift_descriptors.
  super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  feat2.colors.
  super__Vector_base<math::Vector<unsigned_char,_3>,_std::allocator<math::Vector<unsigned_char,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  feat2.colors.
  super__Vector_base<math::Vector<unsigned_char,_3>,_std::allocator<math::Vector<unsigned_char,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  feat2.positions.
  super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  feat2.positions.
  super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  feat2.width = 0;
  feat2.height = 0;
  feat2.positions.
  super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  feat2.surf_descriptors.
  super__Vector_base<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT44(uStack_270,feat2._148_4_);
  feat2.opts.sift_opts.min_octave = feature_set_opts.sift_opts.min_octave;
  feat2.opts.sift_opts.max_octave = feature_set_opts.sift_opts.max_octave;
  feat2.opts.sift_opts.base_blur_sigma = feature_set_opts.sift_opts.base_blur_sigma;
  std::__shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_168,
             &image2->super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>);
  sfm::FeatureSet::compute_features
            ((FeatureSet *)&feat1.opts.surf_opts.use_upright_descriptor,(Ptr *)&local_168);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_168._M_refcount);
  stack0xffffffffffffff34 = 0x7f7fffff3f4ccccd;
  surf_descr1.
  super__Vector_base<math::Vector<float,_64>,_util::AlignedAllocator<math::Vector<float,_64>,_16UL>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0x80;
  auStack_108 = (undefined1  [8])0x0;
  sift_descr1.
  super__Vector_base<math::Vector<float,_128>,_util::AlignedAllocator<math::Vector<float,_128>,_16UL>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sift_descr1.
  super__Vector_base<math::Vector<float,_128>,_util::AlignedAllocator<math::Vector<float,_128>,_16UL>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_98 = (undefined1  [8])0x0;
  sift_descr2.
  super__Vector_base<math::Vector<float,_128>,_util::AlignedAllocator<math::Vector<float,_128>,_16UL>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sift_descr2.
  super__Vector_base<math::Vector<float,_128>,_util::AlignedAllocator<math::Vector<float,_128>,_16UL>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  convert_sift_descriptors<float>
            ((Descriptors *)
             &feat1.colors.
              super__Vector_base<math::Vector<unsigned_char,_3>,_std::allocator<math::Vector<unsigned_char,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (AlignedMemory<math::Vector<float,_128>_> *)auStack_108);
  convert_sift_descriptors<float>
            ((Descriptors *)
             &feat2.colors.
              super__Vector_base<math::Vector<unsigned_char,_3>,_std::allocator<math::Vector<unsigned_char,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (AlignedMemory<math::Vector<float,_128>_> *)auStack_98);
  sift_matching.matches_2_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  sift_matching.matches_2_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  sift_matching.matches_1_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  sift_matching.matches_1_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  feature_set_opts.surf_opts.contrast_threshold = 0.0;
  feature_set_opts.surf_opts.use_upright_descriptor = false;
  feature_set_opts.surf_opts.verbose_output = false;
  feature_set_opts.surf_opts.debug_output = false;
  feature_set_opts.surf_opts._7_1_ = 0;
  sift_matching.matches_1_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  features::Matching::twoway_match<float>
            ((Options *)
             &surf_descr1.
              super__Vector_base<math::Vector<float,_64>,_util::AlignedAllocator<math::Vector<float,_64>,_16UL>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(float *)auStack_108,
             (int)((ulong)((long)sift_descr1.
                                 super__Vector_base<math::Vector<float,_128>,_util::AlignedAllocator<math::Vector<float,_128>,_16UL>_>
                                 ._M_impl.super__Vector_impl_data._M_start - (long)auStack_108) >> 9
                  ),(float *)auStack_98,
             (int)((ulong)((long)sift_descr2.
                                 super__Vector_base<math::Vector<float,_128>,_util::AlignedAllocator<math::Vector<float,_128>,_16UL>_>
                                 ._M_impl.super__Vector_impl_data._M_start - (long)auStack_98) >> 9)
             ,(Result *)&feature_set_opts.surf_opts);
  features::Matching::remove_inconsistent_matches((Result *)&feature_set_opts.surf_opts);
  poVar2 = std::operator<<((ostream *)&std::cout,"Consistent Sift Matches: ");
  iVar1 = features::Matching::count_consistent_matches((Result *)&feature_set_opts.surf_opts);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  std::endl<char,std::char_traits<char>>(poVar2);
  stack0xffffffffffffff40 = 0x7f7fffff3f333333;
  sift_matching_opts.lowe_ratio_threshold = 8.96831e-44;
  auStack_e8 = (undefined1  [8])0x0;
  surf_descr1.
  super__Vector_base<math::Vector<float,_64>,_util::AlignedAllocator<math::Vector<float,_64>,_16UL>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  surf_descr1.
  super__Vector_base<math::Vector<float,_64>,_util::AlignedAllocator<math::Vector<float,_64>,_16UL>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_78 = (undefined1  [8])0x0;
  surf_descr2.
  super__Vector_base<math::Vector<float,_64>,_util::AlignedAllocator<math::Vector<float,_64>,_16UL>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  surf_descr2.
  super__Vector_base<math::Vector<float,_64>,_util::AlignedAllocator<math::Vector<float,_64>,_16UL>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  convert_surf_descriptors<float>
            ((Descriptors *)
             &feat1.sift_descriptors.
              super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (AlignedMemory<math::Vector<float,_64>_> *)auStack_e8);
  convert_surf_descriptors<float>
            ((Descriptors *)
             &feat2.sift_descriptors.
              super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (AlignedMemory<math::Vector<float,_64>_> *)auStack_78);
  surf_matching.matches_2_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  surf_matching.matches_2_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  surf_matching.matches_1_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  surf_matching.matches_1_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sift_matching.matches_2_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  surf_matching.matches_1_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  features::Matching::twoway_match<float>
            ((Options *)&sift_matching_opts.lowe_ratio_threshold,(float *)auStack_e8,
             (int)((ulong)((long)surf_descr1.
                                 super__Vector_base<math::Vector<float,_64>,_util::AlignedAllocator<math::Vector<float,_64>,_16UL>_>
                                 ._M_impl.super__Vector_impl_data._M_start - (long)auStack_e8) >> 8)
             ,(float *)auStack_78,
             (int)((ulong)((long)surf_descr2.
                                 super__Vector_base<math::Vector<float,_64>,_util::AlignedAllocator<math::Vector<float,_64>,_16UL>_>
                                 ._M_impl.super__Vector_impl_data._M_start - (long)auStack_78) >> 8)
             ,(Result *)
              &sift_matching.matches_2_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
  features::Matching::remove_inconsistent_matches
            ((Result *)
             &sift_matching.matches_2_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  poVar2 = std::operator<<((ostream *)&std::cout,"Consistent Surf Matches: ");
  iVar1 = features::Matching::count_consistent_matches
                    ((Result *)
                     &sift_matching.matches_2_1.super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  std::endl<char,std::char_traits<char>>(poVar2);
  matching.matches_2_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  matching.matches_2_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  matching.matches_1_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  matching.matches_1_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  surf_matching.matches_2_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  matching.matches_1_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  match_image.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)image1;
  features::Matching::combine_results
            ((Result *)&feature_set_opts.surf_opts,
             (Result *)
             &sift_matching.matches_2_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (Result *)
             &surf_matching.matches_2_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  poVar2 = std::operator<<((ostream *)&std::cout,"Consistent Matches: ");
  iVar1 = features::Matching::count_consistent_matches
                    ((Result *)
                     &surf_matching.matches_2_1.super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  std::endl<char,std::char_traits<char>>(poVar2);
  surf_descr2.
  super__Vector_base<math::Vector<float,_64>,_util::AlignedAllocator<math::Vector<float,_64>,_16UL>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&match_image;
  matching.matches_2_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  lVar4 = 3;
  for (uVar3 = 0;
      uVar3 < (ulong)(((long)feat1.sift_descriptors.
                             super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>
                             ._M_impl.super__Vector_impl_data._M_start -
                      (long)feat1.colors.
                            super__Vector_base<math::Vector<unsigned_char,_3>,_std::allocator<math::Vector<unsigned_char,_3>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage) / 0x210);
      uVar3 = uVar3 + 1) {
    if (surf_matching.matches_2_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage[uVar3] != -1) {
      output_filename._M_dataplus._M_p._4_4_ =
           *(undefined4 *)
            ((long)feat1.colors.
                   super__Vector_base<math::Vector<unsigned_char,_3>,_std::allocator<math::Vector<unsigned_char,_3>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar4 * 4);
      output_filename._M_dataplus._M_p._0_4_ =
           *(float *)((long)feat1.colors.
                            super__Vector_base<math::Vector<unsigned_char,_3>,_std::allocator<math::Vector<unsigned_char,_3>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar4 * 4 + -4) *
           3.0;
      local_58._0_4_ =
           *(float *)((long)feat1.colors.
                            super__Vector_base<math::Vector<unsigned_char,_3>,_std::allocator<math::Vector<unsigned_char,_3>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar4 * 4 + -0xc);
      local_58._4_4_ =
           *(float *)((long)feat1.colors.
                            super__Vector_base<math::Vector<unsigned_char,_3>,_std::allocator<math::Vector<unsigned_char,_3>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar4 * 4 + -8);
      std::vector<features::Visualizer::Keypoint,_std::allocator<features::Visualizer::Keypoint>_>::
      push_back((vector<features::Visualizer::Keypoint,_std::allocator<features::Visualizer::Keypoint>_>
                 *)&matching.matches_2_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,(value_type *)local_58);
    }
    lVar4 = lVar4 + 0x84;
  }
  auStack_198 = (undefined1  [8])0x0;
  features2.
  super__Vector_base<features::Visualizer::Keypoint,_std::allocator<features::Visualizer::Keypoint>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  features2.
  super__Vector_base<features::Visualizer::Keypoint,_std::allocator<features::Visualizer::Keypoint>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar4 = 3;
  for (uVar3 = 0;
      this._M_pi = match_image.
                   super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi,
      uVar3 < (ulong)(((long)feat2.sift_descriptors.
                             super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>
                             ._M_impl.super__Vector_impl_data._M_start -
                      (long)feat2.colors.
                            super__Vector_base<math::Vector<unsigned_char,_3>,_std::allocator<math::Vector<unsigned_char,_3>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage) / 0x210);
      uVar3 = uVar3 + 1) {
    if (matching.matches_1_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage[uVar3] != -1) {
      output_filename._M_dataplus._M_p._4_4_ =
           *(undefined4 *)
            ((long)feat2.colors.
                   super__Vector_base<math::Vector<unsigned_char,_3>,_std::allocator<math::Vector<unsigned_char,_3>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar4 * 4);
      output_filename._M_dataplus._M_p._0_4_ =
           *(float *)((long)feat2.colors.
                            super__Vector_base<math::Vector<unsigned_char,_3>,_std::allocator<math::Vector<unsigned_char,_3>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar4 * 4 + -4) *
           3.0;
      local_58._0_4_ =
           *(float *)((long)feat2.colors.
                            super__Vector_base<math::Vector<unsigned_char,_3>,_std::allocator<math::Vector<unsigned_char,_3>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar4 * 4 + -0xc);
      local_58._4_4_ =
           *(float *)((long)feat2.colors.
                            super__Vector_base<math::Vector<unsigned_char,_3>,_std::allocator<math::Vector<unsigned_char,_3>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar4 * 4 + -8);
      std::vector<features::Visualizer::Keypoint,_std::allocator<features::Visualizer::Keypoint>_>::
      push_back((vector<features::Visualizer::Keypoint,_std::allocator<features::Visualizer::Keypoint>_>
                 *)auStack_198,(value_type *)local_58);
    }
    lVar4 = lVar4 + 0x84;
  }
  std::__shared_ptr<core::Image<unsigned_char>const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<core::Image<unsigned_char>,void>
            (local_158,
             (__shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2> *)
             match_image.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi);
  features::Visualizer::draw_keypoints
            ((Visualizer *)local_58,(ConstPtr *)local_158,
             (vector<features::Visualizer::Keypoint,_std::allocator<features::Visualizer::Keypoint>_>
              *)&matching.matches_2_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,RADIUS_BOX_ORIENTATION);
  std::__shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2> *)this._M_pi,
             (__shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2> *)local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&output_filename);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_150);
  std::__shared_ptr<core::Image<unsigned_char>const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<core::Image<unsigned_char>,void>
            (local_148,
             &image2->super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>);
  features::Visualizer::draw_keypoints
            ((Visualizer *)local_58,(ConstPtr *)local_148,
             (vector<features::Visualizer::Keypoint,_std::allocator<features::Visualizer::Keypoint>_>
              *)auStack_198,RADIUS_BOX_ORIENTATION);
  std::__shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&image2->super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2> *)local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&output_filename);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_140);
  std::__shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_138,
             (__shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2> *)this._M_pi);
  std::__shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_128,
             &image2->super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>);
  visualize_matching((Result *)&surf_matching_opts.lowe_ratio_threshold,
                     (Ptr *)&surf_matching.matches_2_1.super__Vector_base<int,_std::allocator<int>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,(Ptr *)&local_138,
                     (vector<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_> *)
                     &local_128,
                     (vector<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_> *)
                     &feat1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_128._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_138._M_refcount);
  std::__cxx11::string::string
            ((string *)local_58,"./tmp/matching_featureset.png",
             (allocator *)(output_filename.field_2._M_local_buf + 0xf));
  poVar2 = std::operator<<((ostream *)&std::cout,"Saving visualization to ");
  poVar2 = std::operator<<(poVar2,(string *)local_58);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_118,
             (__shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2> *)
             &surf_matching_opts.lowe_ratio_threshold);
  core::image::save_file((Ptr *)&local_118,(string *)local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_118._M_refcount);
  std::__cxx11::string::~string((string *)local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&match_image);
  std::_Vector_base<features::Visualizer::Keypoint,_std::allocator<features::Visualizer::Keypoint>_>
  ::~_Vector_base((_Vector_base<features::Visualizer::Keypoint,_std::allocator<features::Visualizer::Keypoint>_>
                   *)auStack_198);
  std::_Vector_base<features::Visualizer::Keypoint,_std::allocator<features::Visualizer::Keypoint>_>
  ::~_Vector_base((_Vector_base<features::Visualizer::Keypoint,_std::allocator<features::Visualizer::Keypoint>_>
                   *)&matching.matches_2_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  features::Matching::Result::~Result
            ((Result *)
             &surf_matching.matches_2_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  features::Matching::Result::~Result
            ((Result *)
             &sift_matching.matches_2_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  free((void *)auStack_78);
  free((void *)auStack_e8);
  features::Matching::Result::~Result((Result *)&feature_set_opts.surf_opts);
  free((void *)auStack_98);
  free((void *)auStack_108);
  sfm::FeatureSet::~FeatureSet((FeatureSet *)&feat1.opts.surf_opts.use_upright_descriptor);
  sfm::FeatureSet::~FeatureSet((FeatureSet *)local_3a8);
  return;
}

Assistant:

void
feature_set_matching (core::ByteImage::Ptr image1, core::ByteImage::Ptr image2)
{
    /*FeatureSet 计算并存储一个视角的特征点，包含SIFT和SURF特征点 */
    sfm::FeatureSet::Options feature_set_opts;
    //feature_types设置为FEATURE_ALL表示检测SIFT和SURF两种特征点进行匹配
    feature_set_opts.feature_types = sfm::FeatureSet::FEATURE_SIFT;
    feature_set_opts.sift_opts.verbose_output = true;
    //feature_set_opts.surf_opts.verbose_output = true;
    //feature_set_opts.surf_opts.contrast_threshold = 500.0f;

    // 计算第一幅图像的SIT和SURF特征点
    sfm::FeatureSet feat1(feature_set_opts);
    feat1.compute_features(image1);
    // 计算第二幅图像的SIFT和SURF特征点
    sfm::FeatureSet feat2(feature_set_opts);
    feat2.compute_features(image2);

    /* 对sift特征描述子进行匹配 */
    // sift 特征描述子匹配参数
    sfm::Matching::Options sift_matching_opts;
    sift_matching_opts.lowe_ratio_threshold = 0.8f;
    sift_matching_opts.descriptor_length = 128;
    sift_matching_opts.distance_threshold = std::numeric_limits<float>::max();

#if DISCRETIZE_DESCRIPTORS
    util::AlignedMemory<math::Vec128us, 16> sift_descr1, sift_descr2;
#else
    util::AlignedMemory<math::Vec128f, 16> sift_descr1, sift_descr2;
#endif
    // 将描述子转成特定的内存格式
    convert_sift_descriptors(feat1.sift_descriptors, &sift_descr1);
    convert_sift_descriptors(feat2.sift_descriptors, &sift_descr2);

    // 进行双向匹配
    sfm::Matching::Result sift_matching;
    sfm::Matching::twoway_match(sift_matching_opts,
        sift_descr1.data()->begin(), sift_descr1.size(),
        sift_descr2.data()->begin(), sift_descr2.size(),
        &sift_matching);

    // 去除不一致的匹配对，匹配对feature1和feature2是一致的需要满足，feature1的最近邻居
    // 是feature2，feature2的最近邻是feature1
    sfm::Matching::remove_inconsistent_matches(&sift_matching);
    std::cout << "Consistent Sift Matches: "
        << sfm::Matching::count_consistent_matches(sift_matching)
        << std::endl;


    /*  对surf特征描述子进行匹配  */
    // surf特征匹配参数
    sfm::Matching::Options surf_matching_opts;
    // 最近邻和次近邻的比
    surf_matching_opts.lowe_ratio_threshold = 0.7f;
    // 特征描述子的维度
    surf_matching_opts.descriptor_length = 64;
    surf_matching_opts.distance_threshold = std::numeric_limits<float>::max();

#if DISCRETIZE_DESCRIPTORS
    util::AlignedMemory<math::Vec64s, 16> surf_descr1, surf_descr2;
#else
    util::AlignedMemory<math::Vec64f, 16> surf_descr1, surf_descr2;
#endif
    // 将描述子转化成特殊的格式
    convert_surf_descriptors(feat1.surf_descriptors, &surf_descr1);
    convert_surf_descriptors(feat2.surf_descriptors, &surf_descr2);

    // 进行surf描述子的双向匹配
    sfm::Matching::Result surf_matching;
    sfm::Matching::twoway_match(surf_matching_opts,
        surf_descr1.data()->begin(), surf_descr1.size(),
        surf_descr2.data()->begin(), surf_descr2.size(),
        &surf_matching);
    // 去除不一致的匹配对，匹配对feature 1 和 feature 2 互为最近邻
    sfm::Matching::remove_inconsistent_matches(&surf_matching);
    std::cout << "Consistent Surf Matches: "
        << sfm::Matching::count_consistent_matches(surf_matching)
        << std::endl;

    // 对sift匹配的结果和surf匹配的结果进行融合
    sfm::Matching::Result matching;
    sfm::Matching::combine_results(sift_matching, surf_matching, &matching);

    std::cout << "Consistent Matches: "
        << sfm::Matching::count_consistent_matches(matching)
        << std::endl;

    /* 特征匹配可视化 */
    /* Draw features. */
    std::vector<sfm::Visualizer::Keypoint> features1;
    for (std::size_t i = 0; i < feat1.sift_descriptors.size(); ++i)
    {
        if (matching.matches_1_2[i] == -1)
            continue;

        sfm::Sift::Descriptor const& descr = feat1.sift_descriptors[i];
        sfm::Visualizer::Keypoint kp;
        kp.orientation = descr.orientation;
        kp.radius = descr.scale * 3.0f;
        kp.x = descr.x;
        kp.y = descr.y;
        features1.push_back(kp);
    }

    std::vector<sfm::Visualizer::Keypoint> features2;
    for (std::size_t i = 0; i < feat2.sift_descriptors.size(); ++i)
    {
        if (matching.matches_2_1[i] == -1)
            continue;

        sfm::Sift::Descriptor const& descr = feat2.sift_descriptors[i];
        sfm::Visualizer::Keypoint kp;
        kp.orientation = descr.orientation;
        kp.radius = descr.scale * 3.0f;
        kp.x = descr.x;
        kp.y = descr.y;
        features2.push_back(kp);
    }

    image1 = sfm::Visualizer::draw_keypoints(image1,
        features1, sfm::Visualizer::RADIUS_BOX_ORIENTATION);
    image2 = sfm::Visualizer::draw_keypoints(image2,
        features2, sfm::Visualizer::RADIUS_BOX_ORIENTATION);

    core::ByteImage::Ptr match_image = visualize_matching(
        matching, image1, image2, feat1.positions, feat2.positions);
    std::string output_filename = "./tmp/matching_featureset.png";
    std::cout << "Saving visualization to " << output_filename << std::endl;
    core::image::save_file(match_image, output_filename);
}